

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clean.c
# Opt level: O0

void prvTidyList2BQ(TidyDocImpl *doc,Node *node)

{
  Bool BVar1;
  Node *local_18;
  Node *node_local;
  TidyDocImpl *doc_local;
  
  for (local_18 = node; local_18 != (Node *)0x0; local_18 = local_18->next) {
    if (local_18->content != (Node *)0x0) {
      prvTidyList2BQ(doc,local_18->content);
    }
    if ((local_18->tag != (Dict *)0x0) && (local_18->tag->parser == prvTidyParseList)) {
      BVar1 = HasOneChild(local_18);
      if ((BVar1 != no) && (local_18->content->implicit != no)) {
        StripOnlyChild(doc,local_18);
        RenameElem(doc,local_18,TidyTag_BLOCKQUOTE);
        local_18->implicit = yes;
      }
    }
  }
  return;
}

Assistant:

void TY_(List2BQ)( TidyDocImpl* doc, Node* node )
{
    while (node)
    {
        if (node->content)
            TY_(List2BQ)( doc, node->content );

        if ( node->tag && node->tag->parser == TY_(ParseList) &&
             HasOneChild(node) && node->content->implicit )
        {
            StripOnlyChild( doc, node );
            RenameElem( doc, node, TidyTag_BLOCKQUOTE );
            node->implicit = yes;
        }

        node = node->next;
    }
}